

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

int __thiscall List::binarySearch(List *this,char *key)

{
  Node **ppNVar1;
  int iVar2;
  int iVar3;
  ostream *this_00;
  int local_38;
  int local_34;
  int right;
  int left;
  int mid;
  int keySize;
  Node **arr;
  char *key_local;
  List *this_local;
  
  if ((this->m_sorted & 1U) == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"List doesn\'t sorted");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = -1;
  }
  else {
    ppNVar1 = this->m_indexArray;
    local_34 = 0;
    iVar2 = this->m_listSize + -1;
    while (local_38 = iVar2, local_34 < local_38) {
      iVar2 = (local_34 + local_38) / 2;
      iVar3 = strncmp((ppNVar1[iVar2]->field_1).data.publishingHouse,key,3);
      if (iVar3 < 0) {
        local_34 = iVar2 + 1;
        iVar2 = local_38;
      }
    }
    iVar2 = strncmp((ppNVar1[local_38]->field_1).data.publishingHouse,key,3);
    if (iVar2 == 0) {
      this_local._4_4_ = local_38;
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int binarySearch(char *key) {
        if (!this->m_sorted) {
            cout << "List doesn't sorted" << endl;
            return -1;
        }
        Node **arr = m_indexArray;
        const int keySize = 3;
        int mid, left = 0, right = m_listSize - 1;
        while (left < right) {
            mid = (left + right) / 2;
            if (strncmp(arr[mid]->data.publishingHouse, key, keySize) < 0) {
                left = mid + 1;
            } else {
                right = mid;
            }
        }
        if (strncmp(arr[right]->data.publishingHouse, key, keySize) == 0) {
            return right;
        } else {
            return -1;
        }
    }